

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void duckdb::MinMaxNOperation::
     Finalize<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::GreaterThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  _Iter_comp_iter<bool_(*)(const_duckdb::HeapEntry<duckdb::string_t>_&,_const_duckdb::HeapEntry<duckdb::string_t>_&)>
  _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Vector *this_00;
  TemplatedValidityData<unsigned_long> *pTVar6;
  idx_t iVar7;
  data_ptr_t pdVar8;
  idx_t iVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  string_t sVar15;
  UnifiedVectorFormat state_format;
  idx_t local_c8;
  _Iter_comp_iter<bool_(*)(const_duckdb::HeapEntry<duckdb::string_t>_&,_const_duckdb::HeapEntry<duckdb::string_t>_&)>
  local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  Vector *local_a8;
  ulong local_a0;
  buffer_ptr<ValidityBuffer> *local_98;
  data_ptr_t local_90;
  idx_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_88 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  local_c8 = ListVector::GetListSize(result);
  if (count == 0) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0;
    iVar7 = 0;
    do {
      iVar9 = iVar7;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar9 = (idx_t)(local_78.sel)->sel_vector[iVar7];
      }
      lVar11 = lVar11 + *(long *)(*(long *)(local_78.data + iVar9 * 8) + 0x10);
      iVar7 = iVar7 + 1;
    } while (count != iVar7);
  }
  ListVector::Reserve(result,lVar11 + local_c8);
  local_90 = result->data;
  this_00 = ListVector::GetEntry(result);
  if (count != 0) {
    local_98 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar12 = 0;
    local_a8 = result;
    local_a0 = count;
    do {
      uVar13 = uVar12;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)(local_78.sel)->sel_vector[uVar12];
      }
      uVar1 = uVar12 + local_88;
      lVar11 = *(long *)(local_78.data + uVar13 * 8);
      if ((*(char *)(lVar11 + 0x18) == '\x01') && (lVar14 = *(long *)(lVar11 + 0x10), lVar14 != 0))
      {
        *(idx_t *)(local_90 + uVar1 * 0x10) = local_c8;
        *(long *)(local_90 + uVar1 * 0x10 + 8) = lVar14;
        local_b8._M_comp = UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::Compare;
        pdVar8 = local_90;
        ::std::
        __sort_heap<duckdb::HeapEntry<duckdb::string_t>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(duckdb::HeapEntry<duckdb::string_t>const&,duckdb::HeapEntry<duckdb::string_t>const&)>>
                  (*(HeapEntry<duckdb::string_t> **)(lVar11 + 8),
                   *(HeapEntry<duckdb::string_t> **)(lVar11 + 8) + lVar14,&local_b8);
        if (*(long *)(lVar11 + 0x10) != 0) {
          puVar10 = (undefined8 *)(*(long *)(lVar11 + 8) + 8);
          lVar14 = local_c8 << 4;
          uVar13 = 0;
          do {
            sVar15.value.pointer.ptr = (char *)pdVar8;
            sVar15.value._0_8_ = *puVar10;
            sVar15 = StringVector::AddStringOrBlob
                               ((StringVector *)this_00,(Vector *)puVar10[-1],sVar15);
            pdVar8 = this_00->data;
            *(long *)(pdVar8 + lVar14) = sVar15.value._0_8_;
            *(long *)(pdVar8 + lVar14 + 8) = sVar15.value._8_8_;
            uVar13 = uVar13 + 1;
            puVar10 = puVar10 + 4;
            lVar14 = lVar14 + 0x10;
          } while (uVar13 < *(ulong *)(lVar11 + 0x10));
          local_c8 = local_c8 + uVar13;
          count = local_a0;
          result = local_a8;
        }
      }
      else {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var5 = p_Stack_b0;
          _Var4._M_comp = local_b8._M_comp;
          local_b8._M_comp =
               (_func_bool_HeapEntry<duckdb::string_t>_ptr_HeapEntry<duckdb::string_t>_ptr *)0x0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var4._M_comp;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_98);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar6->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar3 = (byte)uVar1 & 0x3f;
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar1 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != count);
  }
  ListVector::SetListSize(result,local_c8);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}